

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  undefined1 __p [8];
  shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>_>
  shared;
  CommandLineInterface cli;
  BuildParameters supermapParams;
  allocator<char> local_169;
  PrimitiveKvsBuilder<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long>
  local_168;
  string local_158;
  undefined1 local_138 [8];
  _Tuple_impl<0UL,_supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long>_*,_std::default_delete<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long>_>_>
  local_130;
  shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>_>
  local_128;
  shared_ptr<supermap::cli::CommandLineInterface::Handler> local_118;
  shared_ptr<supermap::cli::CommandLineInterface::Handler> local_108;
  shared_ptr<supermap::cli::CommandLineInterface::Handler> local_f8;
  shared_ptr<supermap::cli::CommandLineInterface::Handler> local_e8;
  string local_d8;
  CommandLineInterface local_b8;
  undefined1 local_58 [48];
  double local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"supermap",(allocator<char> *)local_58);
  supermap::cli::CommandLineInterface::CommandLineInterface(&local_b8,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  local_58._0_8_ = 3;
  local_58._8_8_ = 0.5;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_58 + 0x10),"supermap",(allocator<char> *)&local_158);
  local_28 = 0.03125;
  std::make_unique<supermap::BST<supermap::Key<1ul>,unsigned_long,unsigned_long>>();
  local_158._M_dataplus._M_p =
       (pointer)local_168.
                super_KeyValueStorageBuilder<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long>
                ._vptr_KeyValueStorageBuilder;
  local_168.
  super_KeyValueStorageBuilder<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long>
  ._vptr_KeyValueStorageBuilder = (_func_int **)0x0;
  supermap::
  DefaultSupermap<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long>
  ::build((DefaultSupermap<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long>
           *)&local_130,
          (unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<1UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<1UL>,_unsigned_long,_unsigned_long>_>_>
           *)&local_158,(BuildParameters *)local_58);
  if ((long *)local_158._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_158._M_dataplus._M_p + 0x28))();
  }
  local_158._M_dataplus._M_p = (pointer)0x0;
  if (local_168.
      super_KeyValueStorageBuilder<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long>
      ._vptr_KeyValueStorageBuilder != (_func_int **)0x0) {
    (**(code **)(*local_168.
                  super_KeyValueStorageBuilder<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long>
                  ._vptr_KeyValueStorageBuilder + 0x28))();
  }
  local_168.
  super_KeyValueStorageBuilder<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long>
  ._vptr_KeyValueStorageBuilder = (_func_int **)&PTR_build_00127970;
  local_168.kvs_._M_t.
  super___uniq_ptr_impl<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long>_*,_std::default_delete<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long>_>_>
  .
  super__Head_base<0UL,_supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long>_>,_true,_true>
        )(__uniq_ptr_data<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long>_>,_true,_true>
          )local_130.
           super__Head_base<0UL,_supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long>_*,_false>
           ._M_head_impl;
  local_130.
  super__Head_base<0UL,_supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long>_*,_false>
  ._M_head_impl =
       (_Head_base<0UL,_supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long>_*,_false>
        )(KeyValueStorage<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long>
          *)0x0;
  local_158._M_dataplus._M_p = (pointer)&PTR_build_001279b0;
  local_158._M_string_length = (size_type)&local_168;
  supermap::detail::RemovableBuilder<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>::
  build((RemovableBuilder<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long> *)local_138);
  supermap::detail::
  PrimitiveKvsBuilder<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long>
  ::~PrimitiveKvsBuilder(&local_168);
  __p = local_138;
  local_138 = (undefined1  [8])0x0;
  std::
  __shared_ptr<supermap::KeyValueStorage<supermap::Key<1ul>,supermap::ByteArray<1ul>,unsigned_long>,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<supermap::KeyValueStorage<supermap::Key<1ul>,supermap::ByteArray<1ul>,unsigned_long>,void>
            ((__shared_ptr<supermap::KeyValueStorage<supermap::Key<1ul>,supermap::ByteArray<1ul>,unsigned_long>,(__gnu_cxx::_Lock_policy)2>
              *)&local_168,
             (KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long> *)__p);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"add",&local_169);
  std::
  make_shared<supermap::cli::AddKeyHandler<supermap::Key<1ul>,supermap::ByteArray<1ul>,unsigned_long>,std::shared_ptr<supermap::KeyValueStorage<supermap::Key<1ul>,supermap::ByteArray<1ul>,unsigned_long>>&>
            (&local_128);
  local_e8.
  super___shared_ptr<supermap::cli::CommandLineInterface::Handler,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)
           local_128.
           super___shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_e8.
  super___shared_ptr<supermap::cli::CommandLineInterface::Handler,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       local_128.
       super___shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  local_128.
  super___shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_128.
  super___shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  supermap::cli::CommandLineInterface::addCommand(&local_b8,&local_158,&local_e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_e8.
              super___shared_ptr<supermap::cli::CommandLineInterface::Handler,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_128.
              super___shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"remove",&local_169);
  std::
  make_shared<supermap::cli::RemoveKeyHandler<supermap::Key<1ul>,supermap::ByteArray<1ul>,unsigned_long>,std::shared_ptr<supermap::KeyValueStorage<supermap::Key<1ul>,supermap::ByteArray<1ul>,unsigned_long>>&>
            (&local_128);
  local_f8.
  super___shared_ptr<supermap::cli::CommandLineInterface::Handler,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)
           local_128.
           super___shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_f8.
  super___shared_ptr<supermap::cli::CommandLineInterface::Handler,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       local_128.
       super___shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  local_128.
  super___shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_128.
  super___shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  supermap::cli::CommandLineInterface::addCommand(&local_b8,&local_158,&local_f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_f8.
              super___shared_ptr<supermap::cli::CommandLineInterface::Handler,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_128.
              super___shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"contains",&local_169);
  std::
  make_shared<supermap::cli::ContainsKeyHandler<supermap::Key<1ul>,supermap::ByteArray<1ul>,unsigned_long>,std::shared_ptr<supermap::KeyValueStorage<supermap::Key<1ul>,supermap::ByteArray<1ul>,unsigned_long>>&>
            (&local_128);
  local_108.
  super___shared_ptr<supermap::cli::CommandLineInterface::Handler,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)
           local_128.
           super___shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_108.
  super___shared_ptr<supermap::cli::CommandLineInterface::Handler,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       local_128.
       super___shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  local_128.
  super___shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_128.
  super___shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  supermap::cli::CommandLineInterface::addCommand(&local_b8,&local_158,&local_108);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_108.
              super___shared_ptr<supermap::cli::CommandLineInterface::Handler,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_128.
              super___shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"get",&local_169);
  std::
  make_shared<supermap::cli::GetValueHandler<supermap::Key<1ul>,supermap::ByteArray<1ul>,unsigned_long>,std::shared_ptr<supermap::KeyValueStorage<supermap::Key<1ul>,supermap::ByteArray<1ul>,unsigned_long>>&>
            (&local_128);
  local_118.
  super___shared_ptr<supermap::cli::CommandLineInterface::Handler,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)
           local_128.
           super___shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_118.
  super___shared_ptr<supermap::cli::CommandLineInterface::Handler,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       local_128.
       super___shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  local_128.
  super___shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_128.
  super___shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  supermap::cli::CommandLineInterface::addCommand(&local_b8,&local_158,&local_118);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_118.
              super___shared_ptr<supermap::cli::CommandLineInterface::Handler,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_128.
              super___shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::string::~string((string *)&local_158);
  supermap::cli::CommandLineInterface::run(&local_b8,(istream *)&std::cin,(ostream *)&std::cout);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_168.kvs_);
  if (local_138 != (undefined1  [8])0x0) {
    (**(code **)(*(_func_int **)local_138 + 0x28))();
  }
  if (local_130.
      super__Head_base<0UL,_supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long>_*,_false>
      ._M_head_impl !=
      (KeyValueStorage<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long>
       *)0x0) {
    (*(*(_func_int ***)
        local_130.
        super__Head_base<0UL,_supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long>_*,_false>
        ._M_head_impl)[5])();
  }
  std::__cxx11::string::~string((string *)(local_58 + 0x10));
  supermap::cli::CommandLineInterface::~CommandLineInterface(&local_b8);
  return 0;
}

Assistant:

int main(int, const char **) {
    supermap::cli::CommandLineInterface cli("supermap");

    using K = supermap::Key<1>;
    using V = supermap::ByteArray<1>;
    using I = std::uint64_t;
    using MaybeV = supermap::MaybeRemovedValue<V>;

    using SupermapBuilder = supermap::DefaultSupermap<K, MaybeV, I>;

    auto supermapParams = SupermapBuilder::BuildParameters{
        3,
        0.5,
        "supermap",
        1 / 32.0
    };

    auto backendKvs = SupermapBuilder::build(
        std::make_unique<supermap::BST<K, I, I>>(),
        supermapParams
    );

    std::unique_ptr<supermap::KeyValueStorage<K, V, I>> kvs =
        supermap::builder::fromKvs<K, MaybeV, I>(std::move(backendKvs))
            .removable()
            .build();

    std::shared_ptr<supermap::KeyValueStorage<K, V, I>>
        shared = std::shared_ptr<supermap::KeyValueStorage<K, V, I>>(kvs.release());

    cli.addCommand("add", std::make_shared<supermap::cli::AddKeyHandler<K, V, I>>(shared));
    cli.addCommand("remove", std::make_shared<supermap::cli::RemoveKeyHandler<K, V, I>>(shared));
    cli.addCommand("contains", std::make_shared<supermap::cli::ContainsKeyHandler<K, V, I>>(shared));
    cli.addCommand("get", std::make_shared<supermap::cli::GetValueHandler<K, V, I>>(shared));

    cli.run(std::cin, std::cout);
}